

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::
findOrInsert<RCCFileInfo::DeduplicationKey>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_> *this,
          DeduplicationKey *key)

{
  Span *pSVar1;
  bool bVar2;
  QHashMultiReturnType<RCCResourceLibrary::CompressionAlgorithm,_int,_int,_QByteArray> hash;
  Bucket BVar3;
  
  hash = qHashMulti<RCCResourceLibrary::CompressionAlgorithm,int,int,QByteArray>
                   (this->seed,&key->compressAlgo,&key->compressLevel,&key->compressThreshold,
                    &key->hash);
  if (this->numBuckets == 0) {
    BVar3 = (Bucket)ZEXT816(0);
  }
  else {
    BVar3 = findBucketWithHash<RCCFileInfo::DeduplicationKey>(this,key,hash);
    bVar2 = true;
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) goto LAB_00115872;
  }
  if (this->numBuckets >> 1 <= this->size) {
    rehash(this,this->size + 1);
    BVar3 = findBucketWithHash<RCCFileInfo::DeduplicationKey>(this,key,hash);
  }
  Span<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::insert
            (BVar3.span,BVar3.index);
  this->size = this->size + 1;
  bVar2 = false;
LAB_00115872:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar3.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }